

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O2

void Sparc_printInst(MCInst *MI,SStream *O,void *Info)

{
  _Bool _Var1;
  sparc_reg Op;
  uint uVar2;
  uint uVar3;
  sparc_cc sVar4;
  sparc_hint sVar5;
  char *pcVar6;
  char *pcVar7;
  MCOperand *pMVar8;
  int64_t iVar9;
  int iVar10;
  int iStack_70;
  char instr [64];
  
  pcVar6 = printAliasInstr(MI,O,Info);
  if (pcVar6 != (char *)0x0) {
    strncpy(instr,pcVar6,0x40);
    instr[0x3f] = '\0';
    pcVar7 = strchr(instr,0x2c);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    Op = Sparc_map_insn(instr);
    MCInst_setOpcodePub(MI,Op);
    uVar2 = MCInst_getOpcode(MI);
    uVar3 = uVar2 - 0x4a;
    if (uVar3 < 0x25) {
      if ((0x1800180003U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
        if ((0x180UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_0022351d;
        if (MI->csh->detail == CS_OPT_OFF) goto LAB_00223859;
        pcVar7 = instr + 2;
        goto LAB_0022382a;
      }
LAB_00223680:
      if (MI->csh->detail == CS_OPT_OFF) goto LAB_00223859;
      pcVar7 = instr + 1;
LAB_00223811:
      sVar4 = Sparc_map_ICC(pcVar7);
    }
    else {
LAB_0022351d:
      uVar3 = uVar2 - 0x1c6;
      if (0x18 < uVar3) {
LAB_0022352c:
        if ((uVar2 - 0xbb < 0x1c) && ((0xc000033U >> (uVar2 - 0xbb & 0x1f) & 1) != 0)) {
          if (MI->csh->detail == CS_OPT_OFF) goto LAB_00223859;
          pcVar7 = instr + 5;
        }
        else {
          if ((0x12 < uVar2 - 0x14a) ||
             (((0x60003U >> (uVar2 - 0x14a & 0x1f) & 1) == 0 || (MI->csh->detail == CS_OPT_OFF))))
          goto LAB_00223859;
          pcVar7 = instr + 3;
        }
        goto LAB_00223811;
      }
      if ((0x700000U >> (uVar3 & 0x1f) & 1) == 0) {
        if ((3U >> (uVar3 & 0x1f) & 1) != 0) goto LAB_00223680;
        if ((0x1800000U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_0022352c;
        if (MI->csh->detail == CS_OPT_OFF) goto LAB_00223859;
        pcVar7 = instr + 3;
      }
      else {
        if (MI->csh->detail == CS_OPT_OFF) goto LAB_00223859;
        pcVar7 = instr + 5;
      }
LAB_0022382a:
      sVar4 = Sparc_map_FCC(pcVar7);
    }
    (MI->flat_insn->detail->field_6).sparc.cc = sVar4;
    sVar5 = Sparc_map_hint(pcVar6);
    (MI->flat_insn->detail->field_6).sparc.hint = sVar5;
LAB_00223859:
    (*cs_mem_free)(pcVar6);
    return;
  }
  uVar3 = MCInst_getOpcode(MI);
  if (uVar3 - 0x1d4 < 6) {
    if (((MI->csh->mode & CS_MODE_M680X_6801) != CS_MODE_ARM) ||
       (uVar3 = MCInst_getNumOperands(MI), uVar3 != 3)) goto LAB_0022376d;
    pMVar8 = MCInst_getOperand(MI,0);
    _Var1 = MCOperand_isReg(pMVar8);
    if (!_Var1) goto LAB_0022376d;
    pMVar8 = MCInst_getOperand(MI,0);
    uVar3 = MCOperand_getReg(pMVar8);
    if (uVar3 != 0x43) goto LAB_0022376d;
    uVar3 = MCInst_getOpcode(MI);
    uVar3 = uVar3 - 0x1d4;
    if (uVar3 < 5) {
      pcVar6 = &DAT_004f0c64 + *(int *)(&DAT_004f0c64 + (ulong)uVar3 * 4);
      uVar3 = *(uint *)(&DAT_004f0c78 + (ulong)uVar3 * 4);
    }
    else {
      uVar3 = 0x46;
      pcVar6 = "fcmps\t";
    }
    SStream_concat0(O,pcVar6);
    MCInst_setOpcodePub(MI,uVar3);
    printOperand(MI,1,O);
    SStream_concat0(O,", ");
    goto LAB_00223e52;
  }
  if ((uVar3 - 0x12d < 2) && (uVar3 = MCInst_getNumOperands(MI), uVar3 == 3)) {
    pMVar8 = MCInst_getOperand(MI,0);
    _Var1 = MCOperand_isReg(pMVar8);
    if (_Var1) {
      pMVar8 = MCInst_getOperand(MI,0);
      uVar3 = MCOperand_getReg(pMVar8);
      if (uVar3 == 0x66) {
        SStream_concat0(O,"call ");
        uVar3 = 0x1b;
      }
      else {
        if (uVar3 != 0x47) goto LAB_0022376d;
        pMVar8 = MCInst_getOperand(MI,2);
        _Var1 = MCOperand_isImm(pMVar8);
        if (_Var1) {
          pMVar8 = MCInst_getOperand(MI,2);
          iVar9 = MCOperand_getImm(pMVar8);
          if (iVar9 == 8) {
            pMVar8 = MCInst_getOperand(MI,1);
            uVar3 = MCOperand_getReg(pMVar8);
            if (uVar3 == 0x66) {
              SStream_concat0(O,"retl");
              uVar3 = 0x116;
LAB_00223eb8:
              MCInst_setOpcodePub(MI,uVar3);
              return;
            }
            if (uVar3 == 0x56) {
              SStream_concat0(O,"ret");
              uVar3 = 0x115;
              goto LAB_00223eb8;
            }
          }
        }
        SStream_concat0(O,"jmp\t");
        uVar3 = 0x11;
      }
      MCInst_setOpcodePub(MI,uVar3);
      iVar10 = 1;
      goto LAB_00223db0;
    }
  }
LAB_0022376d:
  uVar3 = MCInst_getOpcode(MI);
  uVar3 = *(uint *)(printInstruction_OpInfo + (ulong)uVar3 * 4);
  SStream_concat0(O,&UNK_004f022f + (uVar3 & 0xfff));
  switch(uVar3 >> 0xc & 0xf) {
  case 1:
    printOperand(MI,1,O);
    switch(uVar3 >> 0x10 & 0xf) {
    case 0:
      goto switchD_002239f1_caseD_0;
    case 1:
      goto switchD_002237c2_caseD_6;
    case 2:
switchD_002239f1_caseD_2:
      SStream_concat0(O," ");
      iVar10 = 0;
      switch(uVar3 >> 0x14 & 3) {
      case 1:
        goto switchD_00223a45_caseD_1;
      case 2:
        goto switchD_00223a45_caseD_2;
      }
      goto switchD_00223a45_caseD_0;
    case 3:
switchD_002239f1_caseD_3:
      SStream_concat0(O,",a ");
      if (MI->csh->detail == CS_OPT_OFF) {
        iVar10 = 0;
        switch(uVar3 >> 0x14 & 3) {
        default:
          goto switchD_00223a45_caseD_0;
        case 1:
          goto switchD_00223a45_caseD_1;
        case 2:
          goto switchD_00223a45_caseD_2;
        }
      }
      (MI->flat_insn->detail->field_6).arm.vector_size = 1;
      iVar10 = 0;
      switch(uVar3 >> 0x14 & 3) {
      default:
        goto switchD_00223a45_caseD_0;
      case 1:
        goto switchD_00223a45_caseD_1;
      case 2:
        goto switchD_00223a45_caseD_2;
      }
    case 4:
switchD_002239f1_caseD_4:
      SStream_concat0(O,",a,pn ");
      if (MI->csh->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm.vector_size = 5;
      }
      goto LAB_00223c35;
    case 5:
switchD_002239f1_caseD_5:
      SStream_concat0(O,",pn ");
      if (MI->csh->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm.vector_size = 4;
      }
LAB_00223c35:
      iVar10 = 2;
LAB_00223c37:
      printOperand(MI,iVar10,O);
      goto LAB_00223c4d;
    case 6:
switchD_002239f1_caseD_6:
      SStream_concat0(O," %icc, ");
      Sparc_add_reg(MI,0x45);
      iVar10 = 0;
      switch(uVar3 >> 0x14 & 3) {
      default:
        goto switchD_00223a45_caseD_0;
      case 1:
        goto switchD_00223a45_caseD_1;
      case 2:
        goto switchD_00223a45_caseD_2;
      }
    case 7:
switchD_002239f1_caseD_7:
      SStream_concat0(O,",a %icc, ");
      if (MI->csh->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm.vector_size = 1;
      }
      break;
    case 8:
switchD_002239f1_caseD_8:
      SStream_concat0(O,",a,pn %icc, ");
      if (MI->csh->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm.vector_size = 5;
      }
      break;
    case 9:
switchD_002239f1_caseD_9:
      SStream_concat0(O,",pn %icc, ");
      if (MI->csh->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm.vector_size = 4;
      }
      break;
    case 10:
switchD_002239f1_caseD_a:
      SStream_concat0(O," %xcc, ");
      Sparc_add_reg(MI,0x57);
      iVar10 = 0;
      switch(uVar3 >> 0x14 & 3) {
      default:
        goto switchD_00223a45_caseD_0;
      case 1:
        goto switchD_00223a45_caseD_1;
      case 2:
        goto switchD_00223a45_caseD_2;
      }
    case 0xb:
switchD_002239f1_caseD_b:
      SStream_concat0(O,",a %xcc, ");
      if (MI->csh->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm.vector_size = 1;
      }
      goto LAB_00223c88;
    case 0xc:
switchD_002239f1_caseD_c:
      SStream_concat0(O,",a,pn %xcc, ");
      if (MI->csh->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm.vector_size = 5;
      }
      goto LAB_00223c88;
    case 0xd:
switchD_002239f1_caseD_d:
      SStream_concat0(O,",pn %xcc, ");
      if (MI->csh->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm.vector_size = 4;
      }
LAB_00223c88:
      uVar3 = 0x57;
      goto LAB_00223d2c;
    case 0xe:
switchD_002239f1_caseD_e:
      SStream_concat0(O,"], ");
      iVar10 = 0;
      switch(uVar3 >> 0x14 & 3) {
      default:
        goto switchD_00223a45_caseD_0;
      case 1:
        goto switchD_00223a45_caseD_1;
      case 2:
        goto switchD_00223a45_caseD_2;
      }
    case 0xf:
switchD_002239f1_caseD_f:
      SStream_concat0(O," %fcc0, ");
      Sparc_add_reg(MI,0x31);
      iVar10 = 1;
      goto LAB_00223c37;
    }
    uVar3 = 0x45;
LAB_00223d2c:
    Sparc_add_reg(MI,uVar3);
    goto LAB_00223d35;
  case 2:
    printOperand(MI,0,O);
    switch(uVar3 >> 0x10 & 0xf) {
    case 1:
      goto switchD_002237c2_caseD_6;
    case 2:
      goto switchD_002239f1_caseD_2;
    case 3:
      goto switchD_002239f1_caseD_3;
    case 4:
      goto switchD_002239f1_caseD_4;
    case 5:
      goto switchD_002239f1_caseD_5;
    case 6:
      goto switchD_002239f1_caseD_6;
    case 7:
      goto switchD_002239f1_caseD_7;
    case 8:
      goto switchD_002239f1_caseD_8;
    case 9:
      goto switchD_002239f1_caseD_9;
    case 10:
      goto switchD_002239f1_caseD_a;
    case 0xb:
      goto switchD_002239f1_caseD_b;
    case 0xc:
      goto switchD_002239f1_caseD_c;
    case 0xd:
      goto switchD_002239f1_caseD_d;
    case 0xe:
      goto switchD_002239f1_caseD_e;
    case 0xf:
      goto switchD_002239f1_caseD_f;
    }
    break;
  case 3:
    printCCOperand(MI,1,O);
    switch(uVar3 >> 0x10 & 0xf) {
    case 1:
      goto switchD_002237c2_caseD_6;
    case 2:
      goto switchD_002239f1_caseD_2;
    case 3:
      goto switchD_002239f1_caseD_3;
    case 4:
      goto switchD_002239f1_caseD_4;
    case 5:
      goto switchD_002239f1_caseD_5;
    case 6:
      goto switchD_002239f1_caseD_6;
    case 7:
      goto switchD_002239f1_caseD_7;
    case 8:
      goto switchD_002239f1_caseD_8;
    case 9:
      goto switchD_002239f1_caseD_9;
    case 10:
      goto switchD_002239f1_caseD_a;
    case 0xb:
      goto switchD_002239f1_caseD_b;
    case 0xc:
      goto switchD_002239f1_caseD_c;
    case 0xd:
      goto switchD_002239f1_caseD_d;
    case 0xe:
      goto switchD_002239f1_caseD_e;
    case 0xf:
      goto switchD_002239f1_caseD_f;
    }
    break;
  case 4:
    iVar10 = 0;
LAB_00223db0:
    printMemOperand(MI,iVar10,O,(char *)0x0);
    return;
  case 5:
    printCCOperand(MI,3,O);
    switch(uVar3 >> 0x10 & 0xf) {
    case 1:
      goto switchD_002237c2_caseD_6;
    case 2:
      goto switchD_002239f1_caseD_2;
    case 3:
      goto switchD_002239f1_caseD_3;
    case 4:
      goto switchD_002239f1_caseD_4;
    case 5:
      goto switchD_002239f1_caseD_5;
    case 6:
      goto switchD_002239f1_caseD_6;
    case 7:
      goto switchD_002239f1_caseD_7;
    case 8:
      goto switchD_002239f1_caseD_8;
    case 9:
      goto switchD_002239f1_caseD_9;
    case 10:
      goto switchD_002239f1_caseD_a;
    case 0xb:
      goto switchD_002239f1_caseD_b;
    case 0xc:
      goto switchD_002239f1_caseD_c;
    case 0xd:
      goto switchD_002239f1_caseD_d;
    case 0xe:
      goto switchD_002239f1_caseD_e;
    case 0xf:
      goto switchD_002239f1_caseD_f;
    }
    break;
  default:
    goto switchD_002237c2_caseD_6;
  case 7:
    printMemOperand(MI,1,O,(char *)0x0);
    switch(uVar3 >> 0x10 & 0xf) {
    case 1:
      goto switchD_002237c2_caseD_6;
    case 2:
      goto switchD_002239f1_caseD_2;
    case 3:
      goto switchD_002239f1_caseD_3;
    case 4:
      goto switchD_002239f1_caseD_4;
    case 5:
      goto switchD_002239f1_caseD_5;
    case 6:
      goto switchD_002239f1_caseD_6;
    case 7:
      goto switchD_002239f1_caseD_7;
    case 8:
      goto switchD_002239f1_caseD_8;
    case 9:
      goto switchD_002239f1_caseD_9;
    case 10:
      goto switchD_002239f1_caseD_a;
    case 0xb:
      goto switchD_002239f1_caseD_b;
    case 0xc:
      goto switchD_002239f1_caseD_c;
    case 0xd:
      goto switchD_002239f1_caseD_d;
    case 0xe:
      goto switchD_002239f1_caseD_e;
    case 0xf:
      goto switchD_002239f1_caseD_f;
    }
    break;
  case 8:
    printMemOperand(MI,1,O,"arith");
    goto LAB_00223c4d;
  case 9:
    printOperand(MI,2,O);
    SStream_concat0(O,", [");
    printMemOperand(MI,0,O,(char *)0x0);
    SStream_concat0(O,"]");
    return;
  case 10:
    printCCOperand(MI,2,O);
    switch(uVar3 >> 0x10 & 0xf) {
    case 1:
      goto switchD_002237c2_caseD_6;
    case 2:
      goto switchD_002239f1_caseD_2;
    case 3:
      goto switchD_002239f1_caseD_3;
    case 4:
      goto switchD_002239f1_caseD_4;
    case 5:
      goto switchD_002239f1_caseD_5;
    case 6:
      goto switchD_002239f1_caseD_6;
    case 7:
      goto switchD_002239f1_caseD_7;
    case 8:
      goto switchD_002239f1_caseD_8;
    case 9:
      goto switchD_002239f1_caseD_9;
    case 10:
      goto switchD_002239f1_caseD_a;
    case 0xb:
      goto switchD_002239f1_caseD_b;
    case 0xc:
      goto switchD_002239f1_caseD_c;
    case 0xd:
      goto switchD_002239f1_caseD_d;
    case 0xe:
      goto switchD_002239f1_caseD_e;
    case 0xf:
      goto switchD_002239f1_caseD_f;
    }
    break;
  case 0xb:
    printCCOperand(MI,4,O);
    SStream_concat0(O," ");
    printOperand(MI,1,O);
    SStream_concat0(O,", ");
    printOperand(MI,2,O);
LAB_00223c4d:
    SStream_concat0(O,", ");
    goto LAB_00223d35;
  }
switchD_002239f1_caseD_0:
  SStream_concat0(O,", ");
  iVar10 = 0;
  switch(uVar3 >> 0x14 & 3) {
  default:
switchD_00223a45_caseD_0:
    printOperand(MI,2,O);
    SStream_concat0(O,", ");
    iVar10 = 0;
    break;
  case 1:
    break;
  case 2:
switchD_00223a45_caseD_2:
    iVar10 = 1;
  }
switchD_00223a45_caseD_1:
  printOperand(MI,iVar10,O);
  switch(uVar3 >> 0x16 & 3) {
  case 0:
switchD_002237c2_caseD_6:
    return;
  case 1:
    SStream_concat0(O,", ");
    uVar3 = uVar3 >> 0x18 & 3;
    if (uVar3 == 1) {
LAB_00223d35:
      iStack_70 = 0;
    }
    else if (uVar3 == 2) {
      iStack_70 = 3;
    }
    else {
LAB_00223e52:
      iStack_70 = 2;
    }
    break;
  case 2:
    SStream_concat0(O," + ");
    iStack_70 = 1;
    break;
  case 3:
    SStream_concat0(O,", %y");
    Sparc_add_reg(MI,0x56);
    return;
  }
  printOperand(MI,iStack_70,O);
  return;
}

Assistant:

void Sparc_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem, *p;
	char instr[64];	// Sparc has no instruction this long

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		strncpy(instr, mnem, sizeof(instr));
		instr[sizeof(instr) - 1] = '\0';
		// does this contains hint with a coma?
		p = strchr(instr, ',');
		if (p)
			*p = '\0';	// now instr only has instruction mnemonic
		MCInst_setOpcodePub(MI, Sparc_map_insn(instr));
		switch(MCInst_getOpcode(MI)) {
			case SP_BCOND:
			case SP_BCONDA:
			case SP_BPICCANT:
			case SP_BPICCNT:
			case SP_BPXCCANT:
			case SP_BPXCCNT:
			case SP_TXCCri:
			case SP_TXCCrr:
				if (MI->csh->detail) {
					// skip 'b', 't'
					MI->flat_insn->detail->sparc.cc = Sparc_map_ICC(instr + 1);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_BPFCCANT:
			case SP_BPFCCNT:
				if (MI->csh->detail) {
					// skip 'fb'
					MI->flat_insn->detail->sparc.cc = Sparc_map_FCC(instr + 2);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_FMOVD_ICC:
			case SP_FMOVD_XCC:
			case SP_FMOVQ_ICC:
			case SP_FMOVQ_XCC:
			case SP_FMOVS_ICC:
			case SP_FMOVS_XCC:
				if (MI->csh->detail) {
					// skip 'fmovd', 'fmovq', 'fmovs'
					MI->flat_insn->detail->sparc.cc = Sparc_map_ICC(instr + 5);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_MOVICCri:
			case SP_MOVICCrr:
			case SP_MOVXCCri:
			case SP_MOVXCCrr:
				if (MI->csh->detail) {
					// skip 'mov'
					MI->flat_insn->detail->sparc.cc = Sparc_map_ICC(instr + 3);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_V9FMOVD_FCC:
			case SP_V9FMOVQ_FCC:
			case SP_V9FMOVS_FCC:
				if (MI->csh->detail) {
					// skip 'fmovd', 'fmovq', 'fmovs'
					MI->flat_insn->detail->sparc.cc = Sparc_map_FCC(instr + 5);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_V9MOVFCCri:
			case SP_V9MOVFCCrr:
				if (MI->csh->detail) {
					// skip 'mov'
					MI->flat_insn->detail->sparc.cc = Sparc_map_FCC(instr + 3);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			default:
				break;
		}
		cs_mem_free(mnem);
	} else {
		if (!printSparcAliasInstr(MI, O))
			printInstruction(MI, O, NULL);
	}
}